

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

Function * __thiscall spvtools::opt::Function::Clone(Function *this,IRContext *ctx)

{
  pointer puVar1;
  const_iterator __position;
  Instruction *pIVar2;
  pointer puVar3;
  Function *pFVar4;
  Function *pFVar5;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var6;
  Instruction *node;
  Instruction *pIVar7;
  pointer *__ptr;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *non_semantic;
  pointer puVar8;
  Instruction *i;
  pointer puVar9;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> bb;
  BasicBlock *local_88;
  BasicBlock *local_80;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_78;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  *local_70;
  BasicBlock *local_68;
  Function *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  pFVar5 = (Function *)operator_new(0xd0);
  _Var6._M_head_impl =
       Instruction::Clone((this->def_inst_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
                          ctx);
  (pFVar5->def_inst_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = _Var6._M_head_impl;
  (pFVar5->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pFVar5->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pFVar5->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar2 = &(pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_003e9ae0;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  unique_id_ = 0;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  context_ = (IRContext *)0x0;
  *(undefined8 *)
   ((long)&(pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.context_ + 6) = 0;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_scope_.lexical_scope_ = 0;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_scope_.inlined_at_ = 0;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar2;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar2;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
  (pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
  _vptr_IntrusiveList = (_func_int **)&PTR__InstructionList_003e9b78;
  (pFVar5->non_semantic_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pFVar5->non_semantic_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pFVar5->non_semantic_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pFVar5->blocks_).
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pFVar5->end_inst_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  (pFVar5->blocks_).
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pFVar5->blocks_).
  super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ::reserve(&pFVar5->params_,
            (long)(this->params_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->params_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  pcStack_40 = std::
               _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/function.cpp:30:7)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/function.cpp:30:7)>
             ::_M_manager;
  local_58._M_unused._0_8_ = (undefined8)pFVar5;
  local_58._8_8_ = ctx;
  ForEachParam(this,(function<void_(const_spvtools::opt::Instruction_*)> *)&local_58,true);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  local_70 = &pFVar5->blocks_;
  pIVar2 = &(this->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
  ;
  pIVar7 = (this->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if (pIVar7 != pIVar2) {
    do {
      node = Instruction::Clone(pIVar7,ctx);
      utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                (&(pFVar5->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>,
                 node);
      pIVar7 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    } while (pIVar7 != pIVar2);
  }
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::reserve(local_70,(long)(this->blocks_).
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->blocks_).
                           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar9 = (this->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = this;
  if (puVar9 != puVar1) {
    do {
      local_58._M_unused._M_object =
           BasicBlock::Clone((puVar9->_M_t).
                             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                             ,ctx);
      local_68 = (BasicBlock *)0x0;
      local_88 = (BasicBlock *)0x0;
      __position._M_current =
           (pFVar5->blocks_).
           super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      ((Function *)local_58._M_unused._0_8_)->def_inst_ =
           (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           )pFVar5;
      local_80 = (BasicBlock *)0x0;
      std::
      vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ::_M_insert_rval(local_70,__position,(value_type *)&local_58);
      if ((Function *)local_58._M_unused._0_8_ != (Function *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)local_58._M_pod_data,
                   (BasicBlock *)local_58._M_unused._0_8_);
      }
      if (local_80 != (BasicBlock *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)&local_80,local_80);
      }
      if (local_88 != (BasicBlock *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)&local_88,local_88);
      }
      local_88 = (BasicBlock *)0x0;
      if (local_68 != (BasicBlock *)0x0) {
        std::default_delete<spvtools::opt::BasicBlock>::operator()
                  ((default_delete<spvtools::opt::BasicBlock> *)&local_68,local_68);
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar1);
  }
  pFVar4 = local_60;
  pIVar7 = Instruction::Clone((local_60->end_inst_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl,ctx);
  pIVar2 = (pFVar5->end_inst_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  (pFVar5->end_inst_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar7;
  if (pIVar2 != (Instruction *)0x0) {
    (**(code **)((long)(pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                       _vptr_IntrusiveNodeBase + 8))();
  }
  std::
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ::reserve(&pFVar5->non_semantic_,
            (long)(pFVar4->non_semantic_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pFVar4->non_semantic_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar8 = (pFVar4->non_semantic_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pFVar4->non_semantic_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar3) {
    do {
      local_78._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
           Instruction::Clone((puVar8->_M_t).
                              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl,ctx);
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                  *)&pFVar5->non_semantic_,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_78);
      if ((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           )local_78._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
          (Instruction *)0x0) {
        (**(code **)(*(long *)local_78._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                              _M_head_impl + 8))();
      }
      local_78._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
           (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            )0x0;
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar3);
  }
  return pFVar5;
}

Assistant:

Function* Function::Clone(IRContext* ctx) const {
  Function* clone =
      new Function(std::unique_ptr<Instruction>(DefInst().Clone(ctx)));
  clone->params_.reserve(params_.size());
  ForEachParam(
      [clone, ctx](const Instruction* inst) {
        clone->AddParameter(std::unique_ptr<Instruction>(inst->Clone(ctx)));
      },
      true);

  for (const auto& i : debug_insts_in_header_) {
    clone->AddDebugInstructionInHeader(
        std::unique_ptr<Instruction>(i.Clone(ctx)));
  }

  clone->blocks_.reserve(blocks_.size());
  for (const auto& b : blocks_) {
    std::unique_ptr<BasicBlock> bb(b->Clone(ctx));
    clone->AddBasicBlock(std::move(bb));
  }

  clone->SetFunctionEnd(std::unique_ptr<Instruction>(EndInst()->Clone(ctx)));

  clone->non_semantic_.reserve(non_semantic_.size());
  for (auto& non_semantic : non_semantic_) {
    clone->AddNonSemanticInstruction(
        std::unique_ptr<Instruction>(non_semantic->Clone(ctx)));
  }
  return clone;
}